

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

ParsedInt anon_unknown.dwarf_de9875::readInt(QStringView text)

{
  char *__size;
  storage_type_conflict *in_RCX;
  char *pcVar1;
  size_t allocSize;
  long in_FS_OFFSET;
  QStringView in;
  QSimpleParsedNumber<unsigned_long_long> QVar2;
  ParsedInt PVar3;
  QVarLengthArray<char,_256LL> latin1;
  char *local_140;
  char *local_138;
  QLatin1 *local_130;
  QLatin1 local_128 [256];
  long local_28;
  
  pcVar1 = (char *)text.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (pcVar1 == (char *)0x0) {
    QVar2 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
  }
  else {
    memset(&local_140,0xaa,0x118);
    local_140 = (char *)0x100;
    local_138 = (char *)0x0;
    local_130 = local_128;
    if (0x100 < (long)pcVar1) {
      local_140 = pcVar1;
      __size = (char *)QtPrivate::expectedAllocSize((size_t)pcVar1,0x10);
      if (__size == (char *)0x0) {
        __size = pcVar1;
      }
      local_130 = (QLatin1 *)malloc((size_t)__size);
      local_140 = __size;
      if (local_130 == (QLatin1 *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          qBadAlloc();
        }
        goto LAB_0034e9ee;
      }
    }
    in.m_data = in_RCX;
    in.m_size = (qsizetype)text.m_data;
    local_138 = pcVar1;
    QLatin1::convertFromUnicode(local_130,pcVar1,in);
    pcVar1 = local_138;
    if ((local_138 == (char *)0x0) || (9 < (int)(char)*local_130 - 0x30U)) {
      QVar2 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
    }
    else {
      QVar2 = qstrntoull((char *)local_130,(qsizetype)local_138,10);
      if ((char *)QVar2.used != pcVar1) {
        QVar2 = (QSimpleParsedNumber<unsigned_long_long>)ZEXT816(0);
      }
    }
    if (local_130 != local_128) {
      QtPrivate::sizedFree(local_130,(size_t)local_140);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    PVar3.result = QVar2.result;
    PVar3.used = QVar2.used;
    return PVar3;
  }
LAB_0034e9ee:
  __stack_chk_fail();
}

Assistant:

ParsedInt readInt(QStringView text)
{
    if (text.isEmpty())
        return {};

    // Converting to Latin-1 because QStringView::toULongLong() works with
    // US-ASCII only by design anyway.
    // Also QStringView::toULongLong() can't be used here as it will happily ignore
    // spaces and accept signs; but various date formats' fields (e.g. all in ISO)
    // should not.
    QVarLengthArray<char> latin1(text.size());
    QLatin1::convertFromUnicode(latin1.data(), text);
    return readInt(QLatin1StringView{latin1.data(), latin1.size()});
}